

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::squeeze
          (View<unsigned_char,_false,_std::allocator<unsigned_long>_> *this)

{
  size_t sVar1;
  size_t *psVar2;
  size_t *end;
  size_t *strideBegin;
  CoordinateOrder *coordinateOrder;
  size_t local_30;
  size_t k;
  size_t j_1;
  size_t j;
  size_t newDimension;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_> *this_local;
  
  testInvariant(this);
  sVar1 = dimension(this);
  if (sVar1 != 0) {
    j = dimension(this);
    for (j_1 = 0; sVar1 = dimension(this), j_1 < sVar1; j_1 = j_1 + 1) {
      sVar1 = shape(this,j_1);
      if (sVar1 == 1) {
        j = j - 1;
      }
    }
    sVar1 = dimension(this);
    if (j != sVar1) {
      if (j == 0) {
        marray_detail::Geometry<std::allocator<unsigned_long>_>::resize(&this->geometry_,0);
        psVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::size(&this->geometry_);
        *psVar2 = 1;
      }
      else {
        local_30 = 0;
        for (k = 0; sVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension
                                      (&this->geometry_), k < sVar1; k = k + 1) {
          psVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                             (&this->geometry_,k);
          if (*psVar2 != 1) {
            psVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                               (&this->geometry_,k);
            sVar1 = *psVar2;
            psVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                               (&this->geometry_,local_30);
            *psVar2 = sVar1;
            psVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides
                               (&this->geometry_,k);
            sVar1 = *psVar2;
            psVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides
                               (&this->geometry_,local_30);
            *psVar2 = sVar1;
            local_30 = local_30 + 1;
          }
        }
        marray_detail::Geometry<std::allocator<unsigned_long>_>::resize(&this->geometry_,j);
        psVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeBegin
                           (&this->geometry_);
        end = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeEnd(&this->geometry_);
        strideBegin = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStridesBegin
                                (&this->geometry_);
        coordinateOrder =
             marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder
                       (&this->geometry_);
        marray_detail::stridesFromShape<unsigned_long*,unsigned_long*>
                  (psVar2,end,strideBegin,coordinateOrder);
        updateSimplicity(this);
      }
    }
  }
  testInvariant(this);
  return;
}

Assistant:

void
View<T, isConst, A>::squeeze()
{
    testInvariant();
    if(dimension() != 0) {
        std::size_t newDimension = dimension();
        for(std::size_t j=0; j<dimension(); ++j) {
            if(shape(j) == 1) {
                --newDimension;
            }
        }
        if(newDimension != dimension()) {
            if(newDimension == 0) {
                geometry_.resize(0);
                geometry_.size() = 1;
            }
            else {
                for(std::size_t j=0, k=0; j<geometry_.dimension(); ++j) {
                    if(geometry_.shape(j) != 1) {
                        geometry_.shape(k) = geometry_.shape(j);
                        geometry_.strides(k) = geometry_.strides(j);
                        ++k;
                    }
                }
                geometry_.resize(newDimension);
                marray_detail::stridesFromShape(geometry_.shapeBegin(), geometry_.shapeEnd(), 
                    geometry_.shapeStridesBegin(), geometry_.coordinateOrder());
                updateSimplicity();
            }
        }
    }
    testInvariant();
}